

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseBuilder::sectionNodeOf(BaseBuilder *this,SectionNode **out,uint32_t sectionId)

{
  CodeHolder *pCVar1;
  uint uVar2;
  Error EVar3;
  ZoneVectorBase *pZVar4;
  ZoneVectorBase *this_00;
  SectionNode *unaff_R13;
  ZoneVectorBase *local_40;
  size_t local_38;
  
  *out = (SectionNode *)0x0;
  pCVar1 = (this->super_BaseEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    return 5;
  }
  if (sectionId < *(uint *)&pCVar1->field_0xe0) {
    this_00 = (ZoneVectorBase *)&this->_sectionNodes;
    uVar2 = *(uint *)&this->field_0x180;
    pZVar4 = this_00;
    if ((uVar2 <= sectionId) && (*(uint *)&this->field_0x184 <= sectionId)) goto LAB_00116bac;
    do {
      if ((sectionId < uVar2) &&
         (unaff_R13 = *(SectionNode **)((long)pZVar4->_data + (ulong)sectionId * 8),
         unaff_R13 != (SectionNode *)0x0)) goto LAB_00116b68;
      if (*(long *)&this->_allocator == 0) {
        sectionNodeOf();
        this_00 = pZVar4;
LAB_00116b92:
        EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      else {
        this_00 = (ZoneVectorBase *)&this->_allocator;
        unaff_R13 = (SectionNode *)ZoneAllocator::_alloc((ZoneAllocator *)this_00,0x40,&local_38);
        local_40 = pZVar4;
        if (unaff_R13 == (SectionNode *)0x0) goto LAB_00116b92;
        *(undefined8 *)unaff_R13 = 0;
        *(undefined8 *)(unaff_R13 + 8) = 0;
        unaff_R13[0x10] = (SectionNode)0x2;
        unaff_R13[0x11] = (SectionNode)(this->_nodeFlags | kHasNoEffect);
        *(undefined8 *)(unaff_R13 + 0x12) = 0;
        *(undefined8 *)(unaff_R13 + 0x1a) = 0;
        *(undefined8 *)(unaff_R13 + 0x20) = 0;
        *(undefined8 *)(unaff_R13 + 0x28) = 0;
        *(uint32_t *)(unaff_R13 + 0x30) = sectionId;
        *(undefined8 *)(unaff_R13 + 0x38) = 0;
      }
      uVar2 = *(uint *)&this->field_0x180;
      if (uVar2 <= sectionId) {
        ZoneVectorBase::_resize(local_40,(ZoneAllocator *)this_00,8,sectionId + 1);
        uVar2 = *(uint *)&this->field_0x180;
      }
      if (sectionId < uVar2) {
        *(SectionNode **)((long)local_40->_data + (ulong)sectionId * 8) = unaff_R13;
LAB_00116b68:
        *out = unaff_R13;
        return 0;
      }
      sectionNodeOf();
LAB_00116bac:
      EVar3 = ZoneVectorBase::_reserve(this_00,&this->_allocator,8,sectionId + 1);
      if (EVar3 != 0) goto LAB_00116bcd;
      uVar2 = *(uint *)&this->field_0x180;
      pZVar4 = this_00;
    } while( true );
  }
  EVar3 = 0x13;
LAB_00116bcd:
  EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar3,(char *)0x0);
  return EVar3;
}

Assistant:

Error BaseBuilder::sectionNodeOf(SectionNode** out, uint32_t sectionId) {
  *out = nullptr;

  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!_code->isSectionValid(sectionId)))
    return reportError(DebugUtils::errored(kErrorInvalidSection));

  if (sectionId >= _sectionNodes.size()) {
    Error err = _sectionNodes.reserve(&_allocator, sectionId + 1);
    if (ASMJIT_UNLIKELY(err != kErrorOk))
      return reportError(err);
  }

  SectionNode* node = nullptr;
  if (sectionId < _sectionNodes.size())
    node = _sectionNodes[sectionId];

  if (!node) {
    ASMJIT_PROPAGATE(_newNodeT<SectionNode>(&node, sectionId));

    // We have already reserved enough space, this cannot fail now.
    if (sectionId >= _sectionNodes.size())
      _sectionNodes.resize(&_allocator, sectionId + 1);

    _sectionNodes[sectionId] = node;
  }

  *out = node;
  return kErrorOk;
}